

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr.c
# Opt level: O1

int32 mllr_read_regmat(char *regmatfile,float32 ****A,float32 ***B,float32 ***H,int32 *nclass,
                      int32 ceplen)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  float32 ***inptr;
  float32 **ppfVar5;
  size_t d2;
  ulong uVar6;
  long lVar7;
  float32 ***pppfVar8;
  float32 **tmpptr;
  ulong uVar9;
  int32 n;
  uint local_88;
  uint local_84;
  float32 **local_80;
  float32 **local_78;
  float32 ***local_70;
  float32 ***local_68;
  uint local_5c;
  float32 ****local_58;
  ulong local_50;
  ulong local_48;
  uint *local_40;
  char *local_38;
  
  local_84 = ceplen;
  __stream = fopen(regmatfile,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
            ,0x80,"fopen(%s,r) failed\n",regmatfile);
    return -1;
  }
  local_58 = A;
  local_40 = (uint *)nclass;
  local_38 = regmatfile;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
          ,0x84,"Reading MLLR transformation file %s\n",regmatfile);
  iVar4 = __isoc99_fscanf(__stream,"%d",&local_88);
  uVar2 = local_88;
  local_68 = H;
  if (0 < (int)local_88 && iVar4 == 1) {
    inptr = (float32 ***)0x0;
    iVar4 = __isoc99_fscanf(__stream,"%d",&local_88);
    uVar3 = local_84;
    if (iVar4 == 1) {
      ppfVar5 = (float32 **)0x0;
      tmpptr = (float32 **)0x0;
      if (local_88 == 1) {
        uVar9 = (ulong)uVar2;
        d2 = (size_t)(int)local_84;
        local_70 = B;
        inptr = (float32 ***)
                __ckd_calloc_3d__(uVar9,d2,d2,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                                  ,0x93);
        local_78 = (float32 **)
                   __ckd_calloc_2d__(uVar9,d2,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                                     ,0x94);
        uVar6 = (ulong)uVar3;
        local_48 = uVar9;
        ppfVar5 = (float32 **)
                  __ckd_calloc_2d__(uVar9,d2,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                                    ,0x95);
        local_5c = uVar2;
        pppfVar8 = local_68;
        if (0 < (int)uVar2) {
          lVar1 = uVar6 * 4;
          uVar9 = 0;
          local_80 = ppfVar5;
          local_50 = uVar6;
          do {
            iVar4 = __isoc99_fscanf(__stream,"%d",&local_88);
            ppfVar5 = local_78;
            tmpptr = local_80;
            B = local_70;
            if ((iVar4 != 1) || (local_88 != (uint)uVar6)) goto LAB_0011683f;
            if (0 < (int)(uint)uVar6) {
              uVar6 = 0;
              do {
                lVar7 = 0;
                do {
                  iVar4 = __isoc99_fscanf(__stream,"%f ",(long)inptr[uVar9][uVar6] + lVar7);
                  ppfVar5 = local_78;
                  tmpptr = local_80;
                  B = local_70;
                  if (iVar4 != 1) goto LAB_0011683f;
                  lVar7 = lVar7 + 4;
                } while (lVar1 - lVar7 != 0);
                uVar6 = uVar6 + 1;
              } while (uVar6 != local_50);
            }
            pppfVar8 = local_68;
            if (0 < (int)local_84) {
              lVar7 = 0;
              do {
                iVar4 = __isoc99_fscanf(__stream,"%f ",(long)local_78[uVar9] + lVar7);
                ppfVar5 = local_78;
                tmpptr = local_80;
                B = local_70;
                if (iVar4 != 1) goto LAB_0011683f;
                lVar7 = lVar7 + 4;
              } while (lVar1 - lVar7 != 0);
            }
            if (0 < (int)local_84) {
              lVar7 = 0;
              do {
                iVar4 = __isoc99_fscanf(__stream,"%f ",(long)local_80[uVar9] + lVar7);
                ppfVar5 = local_78;
                tmpptr = local_80;
                B = local_70;
                if (iVar4 != 1) goto LAB_0011683f;
                lVar7 = lVar7 + 4;
              } while (lVar1 - lVar7 != 0);
            }
            uVar9 = uVar9 + 1;
            uVar6 = (ulong)local_84;
            ppfVar5 = local_80;
          } while (uVar9 != local_48);
        }
        *local_58 = inptr;
        *local_70 = local_78;
        *pppfVar8 = ppfVar5;
        if (local_40 != (uint *)0x0) {
          *local_40 = local_5c;
        }
        fclose(__stream);
        return 0;
      }
      goto LAB_0011683f;
    }
  }
  inptr = (float32 ***)0x0;
  ppfVar5 = (float32 **)0x0;
  tmpptr = (float32 **)0x0;
LAB_0011683f:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
          ,0xb7,"Error reading MLLR file %s\n",local_38);
  ckd_free_3d(inptr);
  ckd_free_2d(ppfVar5);
  ckd_free_2d(tmpptr);
  fclose(__stream);
  *local_58 = (float32 ***)0x0;
  *B = (float32 **)0x0;
  *local_68 = (float32 **)0x0;
  return -1;
}

Assistant:

int32
mllr_read_regmat(const char *regmatfile,
                 float32 **** A,
                 float32 *** B,
		 float32 *** H,
		 int32 * nclass, int32 ceplen)
{
    int32 i, j, k, n, lnclass;
    FILE *fp;
    float32 ***lA, **lB, **lH;

    if ((fp = fopen(regmatfile, "r")) == NULL) {
        E_ERROR("fopen(%s,r) failed\n", regmatfile);
        return -1;
    }
    else
        E_INFO("Reading MLLR transformation file %s\n", regmatfile);

    lA = NULL;
    lB = NULL;
    lH = NULL;

    if ((fscanf(fp, "%d", &n) != 1) || (n < 1))
        goto readerror;
    lnclass = n;

    /* The number of stream must be 1 for now (archan@cs.cmu.edu 24-Jul-2004) */
    if ((fscanf(fp, "%d", &n) != 1) || (n != 1))
        goto readerror;

    lA = (float32 ***) ckd_calloc_3d(lnclass, ceplen, ceplen,
                                     sizeof(float32));
    lB = (float32 **) ckd_calloc_2d(lnclass, ceplen, sizeof(float32));
    lH = (float32 **) ckd_calloc_2d(lnclass, ceplen, sizeof(float32));

    for (i = 0; i < lnclass; i++) {
        /* We definitely do not allow different classes to have different
           feature vector lengths! (that would be silly) */
        if ((fscanf(fp, "%d", &n) != 1) || (ceplen != n))
            goto readerror;
        for (j = 0; j < ceplen; j++) {
            for (k = 0; k < ceplen; ++k) {
                if (fscanf(fp, "%f ", &lA[i][j][k]) != 1)
                    goto readerror;
            }
        }
        for (j = 0; j < ceplen; j++) {
            if (fscanf(fp, "%f ", &lB[i][j]) != 1)
                goto readerror;
        }
        for (j = 0; j < ceplen; j++) {
            if (fscanf(fp, "%f ", &lH[i][j]) != 1)
                goto readerror;
        }
    }

    *A = lA;
    *B = lB;
    *H = lH;
    if (nclass)
        *nclass = lnclass;

    fclose(fp);

    return 0;

  readerror:
    E_ERROR("Error reading MLLR file %s\n", regmatfile);
    ckd_free_3d((void ***) lA);
    ckd_free_2d((void **) lB);
    ckd_free_2d((void **) lH);

    fclose(fp);

    *A = NULL;
    *B = NULL;
    *H = NULL;

    return -1;
}